

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-domain-socket-client.c
# Opt level: O0

int main(void)

{
  undefined4 __fd;
  int iVar1;
  size_t sVar2;
  ssize_t sVar3;
  ulong uVar4;
  bool bVar5;
  int len;
  int ok;
  sockaddr_un from;
  char buff [8192];
  undefined1 local_7e [2];
  int ret;
  sockaddr_un addr;
  int fd;
  
  addr.sun_path[0x68] = '\0';
  addr.sun_path[0x69] = '\0';
  addr.sun_path[0x6a] = '\0';
  addr.sun_path[0x6b] = '\0';
  addr.sun_path._100_4_ = socket(1,2,0);
  bVar5 = (int)addr.sun_path._100_4_ < 0;
  if (bVar5) {
    perror("socket");
  }
  bVar5 = !bVar5;
  if (bVar5) {
    memset(local_7e,0,0x6e);
    local_7e = (undefined1  [2])0x1;
    strcpy((char *)&ret,"client.sock");
    unlink("client.sock");
    iVar1 = bind(addr.sun_path._100_4_,(sockaddr *)local_7e,0x6e);
    if (iVar1 < 0) {
      perror("bind");
    }
    bVar5 = iVar1 >= 0 && bVar5;
  }
  if (bVar5) {
    memset(local_7e,0,0x6e);
    local_7e = (undefined1  [2])0x1;
    strcpy((char *)&ret,"server.sock");
    iVar1 = connect(addr.sun_path._100_4_,(sockaddr *)local_7e,0x6e);
    if (iVar1 == -1) {
      perror("connect");
      bVar5 = false;
    }
  }
  if (bVar5) {
    strcpy(from.sun_path + 100,"iccExchangeAPDU");
    __fd = addr.sun_path._100_4_;
    sVar2 = strlen(from.sun_path + 100);
    sVar3 = send(__fd,from.sun_path + 100,sVar2 + 1,0);
    if (sVar3 == -1) {
      perror("send");
      bVar5 = false;
    }
    printf("sent iccExchangeAPDU\n");
  }
  if (bVar5) {
    uVar4 = recv(addr.sun_path._100_4_,from.sun_path + 100,0x2000,0);
    if ((int)uVar4 < 0) {
      perror("recv");
    }
    printf("receive %d %s\n",uVar4 & 0xffffffff,from.sun_path + 100);
  }
  if (-1 < (int)addr.sun_path._100_4_) {
    close(addr.sun_path._100_4_);
  }
  unlink("client.sock");
  return 0;
}

Assistant:

int main() {
    int fd;
    struct sockaddr_un addr;
    int ret;
    char buff[8192];
    struct sockaddr_un from;
    int ok = 1;
    int len;
    
    //////********* UNIX domain  *********//////////
    ///// UNIX domain sockets are a method by which processes on the same host can communicate. 
    /////Communication is bidirectional with stream sockets and unidirectional with datagram sockets.
    
    // i.e fd = socket(AF_UNIX, SOCK_STREAM, 0);
    
    /// PF= Protocol family: Unix domain sockets  PF_UNIX=AF_UNIX
    //NOTE: SOCK_DGRAM socket datagram type communication. other type stream
    if ((fd = socket(PF_UNIX, SOCK_DGRAM, 0)) < 0) {
        perror("socket");
        ok = 0;
    }

    if (ok) {
        memset(&addr, 0, sizeof(addr));
        ///  AF=Address familu UNIX
        addr.sun_family = AF_UNIX;
        ////// path name = client.sock
        strcpy(addr.sun_path, CLIENT_SOCK_FILE);
        // unlink() - delete name and if it's possible the file which is referring for by the name.
        unlink(CLIENT_SOCK_FILE);
        //// int bind (int fd, const struct sockaddr *addr, int addrlen)
        ////  link the socket using the file descriptor a local or a network Address, memorized into addr.
        
        if (bind(fd, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
            perror("bind");
            ok = 0;
        }
    }

    if (ok) {
        memset(&addr, 0, sizeof(addr));
        ///  AF=Address familu UNIX
        addr.sun_family = AF_UNIX;
        ////// path name = server.sock
        strcpy(addr.sun_path, SERVER_SOCK_FILE);
        /// int connect (int fd, const struct sockaddr *addr,int addrlen), 
        ///try to connet to a specific socket created by the client, using the address specified into the addr structure
        if (connect(fd, (struct sockaddr *)&addr, sizeof(addr)) == -1) {
            perror("connect");
            ok = 0;
        }
    }

    if (ok) {
        strcpy (buff, "iccExchangeAPDU");
        //// ssize_t send(int sockfd, const void *buf, size_t len, int flags);  you could use the write function since it's possible use the generic file descriptor
        if (send(fd, buff, strlen(buff)+1, 0) == -1) {
            perror("send");
            ok = 0;
        }
        printf ("sent iccExchangeAPDU\n");
    }

    if (ok) {
        //// ssize_t recv(int sockfd, void *buf, size_t len, int flags);  you could use the read function since it's possible use the generic file descriptor
        if ((len = recv(fd, buff, 8192, 0)) < 0) {
            perror("recv");
            ok = 0;
        }
        printf ("receive %d %s\n", len, buff);
    }

    if (fd >= 0) {
        // close file descriptor
        close(fd);
    }
    // unlink() - delete name and if it's possible the file which is referring for by the name.
    unlink (CLIENT_SOCK_FILE);
    return 0;
}